

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

void enumStringListCallback(void *data,char *str)

{
  _func_void_ptr_PHYSFS_uint64 *p_Var1;
  void *pvVar2;
  size_t sVar3;
  char *__dest;
  EnumStringListCallbackData *pecd;
  char *newstr;
  void *ptr;
  char *str_local;
  void *data_local;
  
  if (*(int *)((long)data + 0xc) == 0) {
    pvVar2 = (*__PHYSFS_AllocatorHooks.Realloc)(*data,(ulong)(*(int *)((long)data + 8) + 2) << 3);
    p_Var1 = __PHYSFS_AllocatorHooks.Malloc;
    sVar3 = strlen(str);
    __dest = (char *)(*p_Var1)(sVar3 + 1);
    if ((pvVar2 == (void *)0x0) || (*(void **)data = pvVar2, __dest == (char *)0x0)) {
      *(undefined4 *)((long)data + 0xc) = 2;
      *(undefined8 *)(*data + (ulong)*(uint *)((long)data + 8) * 8) = 0;
      PHYSFS_freeList(*data);
    }
    else {
      strcpy(__dest,str);
      *(char **)(*data + (ulong)*(uint *)((long)data + 8) * 8) = __dest;
      *(int *)((long)data + 8) = *(int *)((long)data + 8) + 1;
    }
  }
  return;
}

Assistant:

static void enumStringListCallback(void *data, const char *str)
{
    void *ptr;
    char *newstr;
    EnumStringListCallbackData *pecd = (EnumStringListCallbackData *) data;

    if (pecd->errcode)
        return;

    ptr = allocator.Realloc(pecd->list, (pecd->size + 2) * sizeof (char *));
    newstr = (char *) allocator.Malloc(strlen(str) + 1);
    if (ptr != NULL)
        pecd->list = (char **) ptr;

    if ((ptr == NULL) || (newstr == NULL))
    {
        pecd->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        pecd->list[pecd->size] = NULL;
        PHYSFS_freeList(pecd->list);
        return;
    } /* if */

    strcpy(newstr, str);
    pecd->list[pecd->size] = newstr;
    pecd->size++;
}